

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
tinyusdz::tydra::GetGeomSubsets
          (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
           *__return_storage_ptr__,Stage *stage,Path *prim_path,token *familyName,
          bool prim_must_be_geommesh)

{
  bool bVar1;
  __type _Var2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  value_type *pvVar3;
  string *__lhs;
  string *__rhs;
  optional<tinyusdz::Token> local_c0;
  Token *local_98;
  token *tok;
  GeomSubset *local_68;
  GeomSubset *pv;
  Prim *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  Prim *local_38;
  Prim *pprim;
  token *ptStack_28;
  bool prim_must_be_geommesh_local;
  token *familyName_local;
  Path *prim_path_local;
  Stage *stage_local;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *result;
  
  pprim._6_1_ = 0;
  pprim._7_1_ = prim_must_be_geommesh;
  ptStack_28 = familyName;
  familyName_local = (token *)prim_path;
  prim_path_local = (Path *)stage;
  stage_local = (Stage *)__return_storage_ptr__;
  ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::vector
            (__return_storage_ptr__);
  local_38 = (Prim *)0x0;
  bVar1 = Stage::find_prim_at_path
                    ((Stage *)prim_path_local,(Path *)familyName_local,&local_38,(string *)0x0);
  if (((bVar1) && (local_38 != (Prim *)0x0)) &&
     (((pprim._7_1_ & 1) == 0 || (bVar1 = Prim::is<tinyusdz::GeomMesh>(local_38), bVar1)))) {
    this = Prim::children(local_38);
    __end2._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                           ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
    p = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                          ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                       *)&p), bVar1) {
      pv = (GeomSubset *)
           __gnu_cxx::
           __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
           ::operator*(&__end2);
      local_68 = Prim::as<tinyusdz::GeomSubset>((Prim *)pv);
      if (local_68 != (GeomSubset *)0x0) {
        bVar1 = Token::valid(ptStack_28);
        if (bVar1) {
          bVar1 = TypedAttribute<tinyusdz::Token>::authored(&local_68->familyName);
          if (bVar1) {
            TypedAttribute<tinyusdz::Token>::get_value
                      ((optional<tinyusdz::Token> *)&tok,&local_68->familyName);
            bVar1 = nonstd::optional_lite::optional<tinyusdz::Token>::has_value
                              ((optional<tinyusdz::Token> *)&tok);
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)&tok);
            if (bVar1) {
              TypedAttribute<tinyusdz::Token>::get_value(&local_c0,&local_68->familyName);
              pvVar3 = nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_c0);
              nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_c0);
              local_98 = pvVar3;
              __lhs = Token::str_abi_cxx11_(ptStack_28);
              __rhs = Token::str_abi_cxx11_(local_98);
              _Var2 = ::std::operator==(__lhs,__rhs);
              if (_Var2) {
                ::std::
                vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                ::push_back(__return_storage_ptr__,&local_68);
              }
            }
          }
          else {
            ::std::
            vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
            push_back(__return_storage_ptr__,&local_68);
          }
        }
        else {
          ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ::push_back(__return_storage_ptr__,&local_68);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const GeomSubset *> GetGeomSubsets(
    const tinyusdz::Stage &stage, const tinyusdz::Path &prim_path,
    const tinyusdz::value::token &familyName, bool prim_must_be_geommesh) {
  std::vector<const GeomSubset *> result;

  const Prim *pprim{nullptr};
  if (!stage.find_prim_at_path(prim_path, pprim)) {
    return result;
  }

  if (!pprim) {
    return result;
  }

  if (prim_must_be_geommesh && !pprim->is<GeomMesh>()) {
    return result;
  }

  // Only account for child Prims.
  for (const auto &p : pprim->children()) {
    if (auto pv = p.as<GeomSubset>()) {
      if (familyName.valid()) {
        if (pv->familyName.authored()) {
          if (pv->familyName.get_value().has_value()) {
            const value::token &tok = pv->familyName.get_value().value();
            if (familyName.str() == tok.str()) {
              result.push_back(pv);
            }
          } else {
            // connection attr or value block?
            // skip adding this GeomSubset.
          }
        } else {
          result.push_back(pv);
        }
      } else {
        result.push_back(pv);
      }
    }
  }

  return result;
}